

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O3

obj_property * brand_property(wchar_t brand_idx)

{
  char *__needle;
  char *pcVar1;
  obj_property *prop;
  obj_property *poVar2;
  long lVar3;
  
  if (1 < (ulong)z_info->property_max) {
    __needle = brands[brand_idx].name;
    poVar2 = obj_properties + 1;
    lVar3 = (ulong)z_info->property_max - 1;
    do {
      pcVar1 = strstr(poVar2->name,__needle);
      if (pcVar1 != (char *)0x0) {
        return poVar2;
      }
      poVar2 = poVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (obj_property *)0x0;
}

Assistant:

struct obj_property *brand_property(int brand_idx)
{
	int i;

	for (i = 1; i < z_info->property_max; i++) {
		struct obj_property *prop =	&obj_properties[i];
		char *s = strstr(prop->name, brands[brand_idx].name);
		if (s) return prop;
	}
	return NULL;
}